

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O3

void * gdImageGdPtr(gdImagePtr im,int *size)

{
  gdIOCtx *out;
  void *pvVar1;
  
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out == (gdIOCtx *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    _gdImageGd(im,out);
    pvVar1 = gdDPExtractData(out,size);
    (*out->gd_free)(out);
  }
  return pvVar1;
}

Assistant:

BGD_DECLARE(void *) gdImageGdPtr (gdImagePtr im, int *size)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx (2048, NULL);
	if (out == NULL) return NULL;
	_gdImageGd (im, out);
	rv = gdDPExtractData (out, size);
	out->gd_free (out);
	return rv;
}